

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

size_t CountPSBTUnsignedInputs(PartiallySignedTransaction *psbt)

{
  long lVar1;
  pointer pPVar2;
  bool bVar3;
  size_t sVar4;
  PSBTInput *input;
  pointer input_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar4 = 0;
  for (input_00 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                  super__Vector_impl_data._M_start; input_00 != pPVar2; input_00 = input_00 + 1) {
    bVar3 = PSBTInputSigned(input_00);
    sVar4 = sVar4 + !bVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountPSBTUnsignedInputs(const PartiallySignedTransaction& psbt) {
    size_t count = 0;
    for (const auto& input : psbt.inputs) {
        if (!PSBTInputSigned(input)) {
            count++;
        }
    }

    return count;
}